

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O0

void Bmc_FxAddClauses(sat_solver *pSat,Vec_Int_t *vDivs,int iCiVarBeg,int iVarStart)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int nDivs;
  int pLits [3];
  int Func;
  int i;
  int iVarStart_local;
  int iCiVarBeg_local;
  Vec_Int_t *vDivs_local;
  sat_solver *pSat_local;
  
  iVar1 = Vec_IntSize(vDivs);
  iVar1 = iVar1 / 4;
  iVar2 = Vec_IntSize(vDivs);
  if (iVar2 % 4 != 0) {
    __assert_fail("Vec_IntSize(vDivs) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                  ,0x288,"void Bmc_FxAddClauses(sat_solver *, Vec_Int_t *, int, int)");
  }
  pLits[2] = 0;
  do {
    if (iVar1 <= pLits[2]) {
      return;
    }
    iVar2 = Vec_IntEntry(vDivs,pLits[2] << 2);
    iVar3 = Vec_IntEntry(vDivs,pLits[2] * 4 + 1);
    iVar4 = Vec_IntEntry(vDivs,pLits[2] * 4 + 2);
    iVar5 = Vec_IntEntry(vDivs,pLits[2] * 4 + 3);
    if (iVar2 == 1) {
      iVar2 = Abc_Lit2Var(iVar3);
      iVar5 = Abc_Lit2Var(iVar4);
      iVar3 = Abc_LitIsCompl(iVar3);
      iVar4 = Abc_LitIsCompl(iVar4);
      sat_solver_add_and(pSat,(iVarStart + iVar1 + -1) - pLits[2],iCiVarBeg + iVar2,
                         iCiVarBeg + iVar5,iVar3,iVar4,0);
    }
    else if (iVar2 == 2) {
      iVar2 = Abc_Lit2Var(iVar3);
      iVar3 = Abc_Lit2Var(iVar4);
      sat_solver_add_xor(pSat,(iVarStart + iVar1 + -1) - pLits[2],iCiVarBeg + iVar2,
                         iCiVarBeg + iVar3,0);
    }
    else {
      if (iVar2 != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                      ,0x29c,"void Bmc_FxAddClauses(sat_solver *, Vec_Int_t *, int, int)");
      }
      iVar2 = Abc_Lit2Var(iVar3);
      iVar6 = Abc_Lit2Var(iVar4);
      iVar7 = Abc_Lit2Var(iVar5);
      iVar3 = Abc_LitIsCompl(iVar3);
      iVar4 = Abc_LitIsCompl(iVar4);
      iVar5 = Abc_LitIsCompl(iVar5);
      sat_solver_add_mux(pSat,(iVarStart + iVar1 + -1) - pLits[2],iCiVarBeg + iVar2,
                         iCiVarBeg + iVar6,iCiVarBeg + iVar7,iVar3,iVar4,iVar5,0);
    }
    pLits[2] = pLits[2] + 1;
  } while( true );
}

Assistant:

void Bmc_FxAddClauses( sat_solver * pSat, Vec_Int_t * vDivs, int iCiVarBeg, int iVarStart )
{
    int i, Func, pLits[3], nDivs = Vec_IntSize(vDivs)/4;
    assert( Vec_IntSize(vDivs) % 4 == 0 );
    // create new var for each divisor
    for ( i = 0; i < nDivs; i++ )
    {
        Func     = Vec_IntEntry(vDivs, 4*i+0);
        pLits[0] = Vec_IntEntry(vDivs, 4*i+1);
        pLits[1] = Vec_IntEntry(vDivs, 4*i+2);
        pLits[2] = Vec_IntEntry(vDivs, 4*i+3);
        //printf( "Adding clause with vars %d %d -> %d\n", iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), iVarStart + nDivs - 1 - i );
        if ( Func == DIV_AND )
            sat_solver_add_and( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), 
                Abc_LitIsCompl(pLits[0]), Abc_LitIsCompl(pLits[1]), 0 );
        else if ( Func == DIV_XOR )
            sat_solver_add_xor( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), 0 );
        else if ( Func == DIV_MUX )
            sat_solver_add_mux( pSat, 
                iVarStart + nDivs - 1 - i, iCiVarBeg + Abc_Lit2Var(pLits[0]), iCiVarBeg + Abc_Lit2Var(pLits[1]), iCiVarBeg + Abc_Lit2Var(pLits[2]), 
                Abc_LitIsCompl(pLits[0]), Abc_LitIsCompl(pLits[1]), Abc_LitIsCompl(pLits[2]), 0 );
        else assert( 0 );
    }
}